

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins.c
# Opt level: O0

void fsnav_ins_write_sensors(void)

{
  char *pcVar1;
  int local_88;
  int local_84;
  int j;
  int i;
  char *cfg_ptr;
  int fmt [12];
  char *header [6];
  int num_col;
  char sensors_file_token [12];
  
  header[5]._4_1_ = 's';
  header[5]._5_1_ = 'e';
  header[5]._6_1_ = 'n';
  header[5]._7_1_ = 's';
  num_col._0_1_ = 'o';
  num_col._1_1_ = 'r';
  num_col._2_1_ = 's';
  num_col._3_1_ = '_';
  header[5]._0_4_ = 6;
  memcpy(fmt + 10,&PTR_anon_var_dwarf_35fa_00116ba0,0x30);
  memcpy(&cfg_ptr,&DAT_00114840,0x30);
  if (fsnav->imu != (fsnav_imu *)0x0) {
    if (fsnav->mode == 0) {
      pcVar1 = fsnav_locate_token((char *)((long)header + 0x2c),fsnav->cfg,fsnav->cfglength,'=');
      if (pcVar1 != (char *)0x0) {
        __isoc99_sscanf(pcVar1,"%s",fsnav_ins_write_sensors::buffer);
      }
      fsnav_ins_write_sensors::fp = (FILE *)fopen(fsnav_ins_write_sensors::buffer,"w");
      if ((FILE *)fsnav_ins_write_sensors::fp == (FILE *)0x0) {
        printf("error: couldn\'t open output file \'%s\'.\n",fsnav_ins_write_sensors::buffer);
        fsnav->mode = -1;
      }
      else {
        fprintf((FILE *)fsnav_ins_write_sensors::fp,"%%");
        for (local_88 = 0; local_88 < 6; local_88 = local_88 + 1) {
          fprintf((FILE *)fsnav_ins_write_sensors::fp,"%-*s ",
                  (ulong)(uint)fmt[(long)(local_88 << 1) + -2],header[(long)local_88 + -1]);
        }
      }
    }
    else if (fsnav->mode < 0) {
      if (fsnav_ins_write_sensors::fp != (FILE *)0x0) {
        fclose((FILE *)fsnav_ins_write_sensors::fp);
      }
    }
    else {
      local_88 = 0;
      fprintf((FILE *)fsnav_ins_write_sensors::fp,"\n");
      for (local_84 = 0; local_84 < 3; local_84 = local_84 + 1) {
        fprintf((FILE *)fsnav_ins_write_sensors::fp,"%- *.*lf ",
                fsnav->imu->w[local_84] * (fsnav->imu_const).rad2deg,
                (ulong)(uint)fmt[(long)local_88 + -2],(ulong)(uint)fmt[(long)(local_88 + 1) + -2]);
        local_88 = local_88 + 2;
      }
      for (local_84 = 0; local_84 < 3; local_84 = local_84 + 1) {
        fprintf((FILE *)fsnav_ins_write_sensors::fp,"%- *.*lf ",fsnav->imu->f[local_84],
                (ulong)(uint)fmt[(long)local_88 + -2],(ulong)(uint)fmt[(long)(local_88 + 1) + -2]);
        local_88 = local_88 + 2;
      }
    }
  }
  return;
}

Assistant:

void fsnav_ins_write_sensors(void)
{
	const char  sensors_file_token[] = "sensors_out";

	// заголовок в выходном файле + количество выводимых символов всего и после запятой, для каждого параметра по порядку
	const int   num_col  = 6;         
	const char *header[] = {"w1[d/s]", "w2[d/s]", "w3[d/s]", "f1[m/s^2]", "f2[m/s^2]", "f3[m/s^2]"};
	const int   fmt[]    = { 12,6,      12,6,      12,6,      12,6,        12,6,        12,6      };

	static FILE *fp = NULL;                    // указатель на файл
	static char  buffer[FSNAV_INS_BUFFER_SIZE]; // строковый буфер

	char *cfg_ptr; // указатель на параметр в строке конфигурации
	int   i, j;    // индексы

	// проверка инерциальной подсистемы на шине
	if (fsnav->imu == NULL)
		return;

	// инициализация частного алгоритма
	if (fsnav->mode == 0) {
		// поиск имени выходного файла в конфигурации
		cfg_ptr = fsnav_locate_token(sensors_file_token, fsnav->cfg, fsnav->cfglength, '=');
		if (cfg_ptr != NULL)
			sscanf(cfg_ptr, "%s", buffer);
		// открытие файла
		fp = fopen(buffer, "w");
		if (fp == NULL) {
			printf("error: couldn't open output file '%s'.\n", buffer);
			fsnav->mode = -1;
			return;
		}		
		// строка заголовка
		fprintf(fp, "%%");
		for (j = 0; j < num_col; j++)
			fprintf(fp, "%-*s ", fmt[2*j], header[j]);
	}

	// завершение работы
	else if (fsnav->mode < 0) {
		if (fp != NULL)
			fclose(fp);
		return;
	}

	// операции на каждом шаге
	else {
		j = 0;
		fprintf(fp, "\n");
		for (i = 0; i < 3; i++) fprintf(fp, "%- *.*lf ", fmt[j], fmt[j+1], fsnav->imu->w[i]*fsnav->imu_const.rad2deg), j += 2;
		for (i = 0; i < 3; i++) fprintf(fp, "%- *.*lf ", fmt[j], fmt[j+1], fsnav->imu->f[i]                        ), j += 2;
	}
}